

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

QRectF * __thiscall
QGraphicsScene::itemsBoundingRect(QRectF *__return_storage_ptr__,QGraphicsScene *this)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  QRectF QStack_98;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 *local_68;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__->w = 0.0;
  __return_storage_ptr__->h = 0.0;
  __return_storage_ptr__->xp = 0.0;
  __return_storage_ptr__->yp = 0.0;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = 0xaaaaaaaa;
  uStack_74 = 0xaaaaaaaa;
  uStack_70 = 0xaaaaaaaa;
  uStack_6c = 0xaaaaaaaa;
  (**(code **)(**(long **)(*(long *)(this + 8) + 0x88) + 0x60))
            (&local_78,*(long **)(*(long *)(this + 8) + 0x88),1);
  if (local_68 != (undefined1 *)0x0) {
    lVar2 = CONCAT44(uStack_6c,uStack_70);
    lVar4 = (long)local_68 << 3;
    lVar3 = 0;
    do {
      QGraphicsItem::sceneBoundingRect(&QStack_98,*(QGraphicsItem **)(lVar2 + lVar3));
      QRectF::operator|(&local_58,__return_storage_ptr__);
      __return_storage_ptr__->w = local_58.w;
      __return_storage_ptr__->h = local_58.h;
      *(undefined4 *)&__return_storage_ptr__->xp = local_58.xp._0_4_;
      *(undefined4 *)((long)&__return_storage_ptr__->xp + 4) = local_58.xp._4_4_;
      *(undefined4 *)&__return_storage_ptr__->yp = local_58.yp._0_4_;
      *(undefined4 *)((long)&__return_storage_ptr__->yp + 4) = local_58.yp._4_4_;
      lVar3 = lVar3 + 8;
    } while (lVar4 != lVar3);
  }
  piVar1 = (int *)CONCAT44(uStack_74,local_78);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_74,local_78),8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsScene::itemsBoundingRect() const
{
    // Does not take untransformable items into account.
    QRectF boundingRect;
    const auto items_ = items();
    for (QGraphicsItem *item : items_)
        boundingRect |= item->sceneBoundingRect();
    return boundingRect;
}